

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
BoundedAddBind(ClientContext *context,ScalarFunction *bound_function,
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *arguments)

{
  byte bVar1;
  pointer pEVar2;
  BinderException *this;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  int32_t new_max_val;
  int32_t right_max_val;
  int32_t left_max_val;
  LogicalType *in_stack_fffffffffffffee8;
  LogicalType *in_stack_fffffffffffffef0;
  LogicalType *in_stack_fffffffffffffef8;
  allocator *paVar3;
  byte local_d2;
  allocator local_a9;
  string local_a8 [24];
  LogicalType *in_stack_ffffffffffffff70;
  LogicalType local_88 [24];
  int local_70;
  int32_t local_6c;
  int32_t local_68;
  uint in_stack_ffffffffffffff9c;
  LogicalType local_60 [40];
  LogicalType local_38 [56];
  
  BoundedType::GetDefault();
  in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
  duckdb::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
  pEVar2 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffef0);
  bVar1 = duckdb::LogicalType::operator==(local_38,(LogicalType *)(pEVar2 + 0x38));
  local_d2 = 0;
  if ((bVar1 & 1) != 0) {
    BoundedType::GetDefault();
    in_stack_ffffffffffffff9c = CONCAT13(1,(int3)in_stack_ffffffffffffff9c);
    duckdb::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    pEVar2 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffef0);
    local_d2 = duckdb::LogicalType::operator==(local_60,(LogicalType *)(pEVar2 + 0x38));
  }
  if ((in_stack_ffffffffffffff9c & 0x1000000) != 0) {
    duckdb::LogicalType::~LogicalType(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_38);
  if ((local_d2 & 1) != 0) {
    duckdb::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffef0);
    local_68 = BoundedType::GetMaxValue(in_stack_ffffffffffffff70);
    duckdb::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffef0);
    local_6c = BoundedType::GetMaxValue(in_stack_ffffffffffffff70);
    local_70 = local_68 + local_6c;
    duckdb::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffef0);
    duckdb::vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffef0,
               (size_type)in_stack_fffffffffffffee8);
    duckdb::LogicalType::operator=(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    duckdb::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffef0);
    duckdb::vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffef0,
               (size_type)in_stack_fffffffffffffee8);
    duckdb::LogicalType::operator=(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    BoundedType::Get(in_stack_ffffffffffffff9c);
    duckdb::LogicalType::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    duckdb::LogicalType::~LogicalType(local_88);
    duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<std::default_delete<duckdb::FunctionData>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  paVar3 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"bounded_add expects two BOUNDED types",paVar3);
  duckdb::BinderException::BinderException(this,local_a8);
  __cxa_throw(this,&duckdb::BinderException::typeinfo,duckdb::BinderException::~BinderException);
}

Assistant:

static unique_ptr<FunctionData> BoundedAddBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	if (BoundedType::GetDefault() == arguments[0]->return_type &&
	    BoundedType::GetDefault() == arguments[1]->return_type) {
		auto left_max_val = BoundedType::GetMaxValue(arguments[0]->return_type);
		auto right_max_val = BoundedType::GetMaxValue(arguments[1]->return_type);

		auto new_max_val = left_max_val + right_max_val;
		bound_function.arguments[0] = arguments[0]->return_type;
		bound_function.arguments[1] = arguments[1]->return_type;
		bound_function.return_type = BoundedType::Get(new_max_val);
	} else {
		throw BinderException("bounded_add expects two BOUNDED types");
	}
	return nullptr;
}